

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::anon_unknown_8::SparseIndexNode::~SparseIndexNode(SparseIndexNode *this)

{
  SparseIndexNode *this_00;
  size_type sVar1;
  reference ppSVar2;
  ulong local_18;
  size_t ndx;
  SparseIndexNode *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ::size(&this->children);
    if (sVar1 <= local_18) break;
    ppSVar2 = std::
              vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ::operator[](&this->children,local_18);
    this_00 = *ppSVar2;
    if (this_00 != (SparseIndexNode *)0x0) {
      ~SparseIndexNode(this_00);
      operator_delete(this_00,0x20);
    }
    local_18 = local_18 + 1;
  }
  std::
  vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ::~vector(&this->children);
  return;
}

Assistant:

~SparseIndexNode (void)
	{
		for (size_t ndx = 0; ndx < children.size(); ndx++)
			delete children[ndx];
	}